

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

void dg::vr::RelationsAnalyzer::relateBounds
               (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                *changeLocations,VectorSet<const_llvm::Value_*> *froms,ValueRelations *newGraph,
               Handle placeholder)

{
  ConstantInt *pCVar1;
  ConstantInt *pCVar2;
  Relations rels;
  Relations rels_00;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> unsignedLowerBound;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> signedLowerBound;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> local_50;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> local_40;
  
  local_40 = getBoundOnPointedToValue(changeLocations,froms,SGE);
  rels = local_40.second.bits.super__Base_bitset<1UL>._M_w;
  pCVar1 = local_40.first;
  local_50 = getBoundOnPointedToValue(changeLocations,froms,UGE);
  rels_00 = local_50.second.bits.super__Base_bitset<1UL>._M_w;
  pCVar2 = local_50.first;
  if (pCVar1 != (ConstantInt *)0x0) {
    ValueRelations::set<dg::vr::Bucket,llvm::ConstantInt_const*>
              (newGraph,placeholder,rels,&local_40.first);
  }
  if (pCVar2 != (ConstantInt *)0x0) {
    ValueRelations::set<dg::vr::Bucket,llvm::ConstantInt_const*>
              (newGraph,placeholder,rels_00,&local_50.first);
  }
  return;
}

Assistant:

void RelationsAnalyzer::relateBounds(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms, ValueRelations &newGraph,
        Handle placeholder) {
    auto signedLowerBound =
            getBoundOnPointedToValue(changeLocations, froms, Relation::SGE);
    auto unsignedLowerBound = getBoundOnPointedToValue(
            changeLocations, froms,
            Relation::UGE); // TODO collect upper bound too

    if (signedLowerBound.first)
        newGraph.set(placeholder, signedLowerBound.second,
                     signedLowerBound.first);

    if (unsignedLowerBound.first)
        newGraph.set(placeholder, unsignedLowerBound.second,
                     unsignedLowerBound.first);
}